

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_quad_brick_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,REF_INT dim)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL dy;
  REF_DBL dx;
  REF_DBL z;
  REF_DBL y1;
  REF_DBL y0;
  REF_DBL x1;
  REF_DBL x0;
  REF_INT j;
  REF_INT i;
  REF_INT n;
  REF_INT m;
  REF_INT quad [5];
  REF_INT edg [3];
  REF_INT cell;
  REF_INT node;
  REF_INT global;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_INT dim_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_grid_ptr_local._4_4_ = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (ref_grid_ptr_local._4_4_ == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node_00 = pRVar1->node;
    pRVar1->twod = 1;
    if (pRVar1->mpi->id == 0) {
      for (x0._0_4_ = 0; x0._0_4_ < dim; x0._0_4_ = x0._0_4_ + 1) {
        for (x0._4_4_ = 0; x0._4_4_ < dim; x0._4_4_ = x0._4_4_ + 1) {
          uVar2 = ref_node_add(ref_node_00,(long)(x0._4_4_ + x0._0_4_ * dim),edg + 2);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x7bd,"ref_fixture_quad_brick_grid",(ulong)uVar2,"node");
            return uVar2;
          }
          ref_node_00->real[edg[2] * 0xf] = (1.0 / (double)(dim + -1)) * (double)x0._4_4_ + 0.0;
          ref_node_00->real[edg[2] * 0xf + 1] = (1.0 / (double)(dim + -1)) * (double)x0._0_4_ + 0.0;
          ref_node_00->real[edg[2] * 0xf + 2] = 0.0;
        }
      }
      edg[0] = 1;
      for (x0._4_4_ = 0; x0._4_4_ < dim + -1; x0._4_4_ = x0._4_4_ + 1) {
        quad[4] = x0._4_4_;
        uVar2 = ref_cell_add(pRVar1->cell[0],quad + 4,edg + 1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x7c9,"ref_fixture_quad_brick_grid",(ulong)uVar2,"qua");
          return uVar2;
        }
      }
      edg[0] = 2;
      for (x0._0_4_ = 0; x0._0_4_ < dim + -1; x0._0_4_ = x0._0_4_ + 1) {
        quad[4] = dim + -1 + x0._0_4_ * dim;
        uVar2 = ref_cell_add(pRVar1->cell[0],quad + 4,edg + 1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x7d1,"ref_fixture_quad_brick_grid",(ulong)uVar2,"edg");
          return uVar2;
        }
      }
      edg[0] = 3;
      for (x0._4_4_ = dim + -2; -1 < x0._4_4_; x0._4_4_ = x0._4_4_ + -1) {
        quad[4] = x0._4_4_ + 1 + (dim + -1) * dim;
        uVar2 = ref_cell_add(pRVar1->cell[0],quad + 4,edg + 1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x7d9,"ref_fixture_quad_brick_grid",(ulong)uVar2,"edg");
          return uVar2;
        }
      }
      edg[0] = 4;
      for (x0._0_4_ = dim + -2; -1 < x0._0_4_; x0._0_4_ = x0._0_4_ + -1) {
        quad[4] = (x0._0_4_ + 1) * dim;
        uVar2 = ref_cell_add(pRVar1->cell[0],quad + 4,edg + 1);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x7e1,"ref_fixture_quad_brick_grid",(ulong)uVar2,"edg");
          return uVar2;
        }
      }
      quad[2] = 1;
      for (x0._0_4_ = 0; x0._0_4_ < dim + -1; x0._0_4_ = x0._0_4_ + 1) {
        for (x0._4_4_ = 0; x0._4_4_ < dim + -1; x0._4_4_ = x0._4_4_ + 1) {
          n = x0._4_4_ + x0._0_4_ * dim;
          m = x0._4_4_ + 1 + x0._0_4_ * dim;
          quad[0] = x0._4_4_ + 1 + (x0._0_4_ + 1) * dim;
          quad[1] = x0._4_4_ + (x0._0_4_ + 1) * dim;
          uVar2 = ref_cell_add(pRVar1->cell[6],&n,edg + 1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x7ec,"ref_fixture_quad_brick_grid",(ulong)uVar2,"qua");
            return uVar2;
          }
        }
      }
      ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,(long)(dim * dim));
      if (ref_grid_ptr_local._4_4_ == 0) {
        ref_grid_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
               0x7f0,"ref_fixture_quad_brick_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
      }
    }
    else {
      ref_grid_ptr_local._4_4_ = ref_node_initialize_n_global(ref_node_00,(long)(dim * dim));
      if (ref_grid_ptr_local._4_4_ == 0) {
        ref_grid_ptr_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
               0x7ab,"ref_fixture_quad_brick_grid",(ulong)ref_grid_ptr_local._4_4_,"init glob");
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x7a4
           ,"ref_fixture_quad_brick_grid",(ulong)ref_grid_ptr_local._4_4_,"create");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_quad_brick_grid(REF_GRID *ref_grid_ptr,
                                               REF_MPI ref_mpi, REF_INT dim) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, cell;
  REF_INT edg[3], quad[5];

  REF_INT m, n;
  REF_INT i, j;

  REF_DBL x0 = 0.0;
  REF_DBL x1 = 1.0;

  REF_DBL y0 = 0.0;
  REF_DBL y1 = 1.0;

  REF_DBL z = 0.0;

  REF_DBL dx, dy;

  m = dim;
  n = dim;

  dx = (x1 - x0) / ((REF_DBL)(n - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");
    return REF_SUCCESS;
  }

  /*
  y   3 --- 2
  ^   |     |
  |   |     |
  |   0 --- 1
  |
  +----> x
  */

#define ij2node(i, j, m, n) ((i) + (j) * (m))

  for (j = 0; j < n; j++) {
    for (i = 0; i < m; i++) {
      global = ij2node(i, j, m, n);
      RSS(ref_node_add(ref_node, global, &node), "node");
      ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
      ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
      ref_node_xyz(ref_node, 2, node) = z;
    }
  }

  edg[2] = 1;
  j = 0;
  for (i = 0; i < m - 1; i++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i + 1, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "qua");
  }

  edg[2] = 2;
  i = m - 1;
  for (j = 0; j < n - 1; j++) {
    edg[0] = ij2node(i, j, m, n);
    edg[1] = ij2node(i, j + 1, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 3;
  j = n - 1;
  for (i = m - 2; i >= 0; i--) {
    edg[0] = ij2node(i + 1, j, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  edg[2] = 4;
  i = 0;
  for (j = n - 2; j >= 0; j--) {
    edg[0] = ij2node(i, j + 1, m, n);
    edg[1] = ij2node(i, j, m, n);
    RSS(ref_cell_add(ref_grid_edg(ref_grid), edg, &cell), "edg");
  }

  quad[4] = 1;
  j = 1;
  for (j = 0; j < n - 1; j++) {
    for (i = 0; i < m - 1; i++) {
      quad[0] = ij2node(i, j, m, n);
      quad[1] = ij2node(i + 1, j, m, n);
      quad[2] = ij2node(i + 1, j + 1, m, n);
      quad[3] = ij2node(i, j + 1, m, n);
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }
  }

  RSS(ref_node_initialize_n_global(ref_node, m * n), "init glob");

  return REF_SUCCESS;
}